

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  bool bVar1;
  int iVar2;
  byte local_c1;
  str_attr_accessor local_a8;
  none local_88;
  byte local_79;
  str_attr_accessor local_78;
  cpp_function local_48;
  obj_attr_accessor local_40;
  cpp_function *local_20;
  cpp_function *cf_local;
  char *name__local;
  object *cls_local;
  
  local_20 = cf;
  cf_local = (cpp_function *)name_;
  name__local = (char *)cls;
  cpp_function::name(&local_48);
  object_api<pybind11::handle>::attr
            (&local_40,(object_api<pybind11::handle> *)cls,(object *)&local_48);
  accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_40,cf);
  accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_40);
  object::~object((object *)&local_48);
  iVar2 = strcmp((char *)cf_local,"__eq__");
  local_79 = 0;
  local_c1 = 0;
  if (iVar2 == 0) {
    object_api<pybind11::handle>::attr
              (&local_78,(object_api<pybind11::handle> *)name__local,"__dict__");
    local_79 = 1;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>
                      ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                        *)&local_78,(char (*) [9])"__hash__");
    local_c1 = bVar1 ^ 0xff;
  }
  if ((local_79 & 1) != 0) {
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_78);
  }
  if ((local_c1 & 1) != 0) {
    none::none(&local_88);
    object_api<pybind11::handle>::attr
              (&local_a8,(object_api<pybind11::handle> *)name__local,"__hash__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_a8,&local_88);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_a8);
    none::~none(&local_88);
  }
  return;
}

Assistant:

inline void add_class_method(object &cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (std::strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
        cls.attr("__hash__") = none();
    }
}